

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::ArrayCpyExpr::ArrayCpyExpr
          (ArrayCpyExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *valueExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lengthExpr)

{
  Expr *pEVar1;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TokenExpr_0012b6c8;
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_ARRCPY;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = pos->startIndex;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ArrayCpyExpr_0012ba10;
  (this->valueExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (valueExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (valueExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->lengthExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (lengthExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (lengthExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pEVar1 = (this->valueExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 == (Expr *)0x0) {
    __assert_fail("!!this->valueExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x3a3,
                  "pfederc::ArrayCpyExpr::ArrayCpyExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  if ((this->lengthExpr)._M_t.
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    pEVar1->parent = &this->super_Expr;
    ((this->lengthExpr)._M_t.
     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->parent = &this->super_Expr;
    return;
  }
  __assert_fail("!!this->lengthExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x3a4,
                "pfederc::ArrayCpyExpr::ArrayCpyExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
               );
}

Assistant:

ArrayCpyExpr::ArrayCpyExpr(const Lexer &lexer, const Position &pos,
     std::unique_ptr<Expr> &&valueExpr,
     std::unique_ptr<Expr> &&lengthExpr) noexcept
     : Expr(lexer, ExprType::EXPR_ARRCPY, pos), valueExpr(std::move(valueExpr)),
       lengthExpr(std::move(lengthExpr)) {
  assert(!!this->valueExpr);
  assert(!!this->lengthExpr);

  this->valueExpr->setParent(this);
  this->lengthExpr->setParent(this);
}